

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yprp_enum(lys_ypr_ctx_conflict *pctx,lysp_type_enum *items,LY_DATA_TYPE type,int8_t *flag)

{
  uint16_t *puVar1;
  uint uVar2;
  lysp_ext_instance *exts;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *format;
  int8_t *attr_value;
  uint16_t *puVar6;
  int8_t inner_flag;
  LY_DATA_TYPE local_44;
  char *local_40;
  char *local_38;
  
  local_38 = "enum";
  if (type == LY_TYPE_BITS) {
    local_38 = "bit";
  }
  puVar6 = &items->flags;
  uVar5 = 0;
  local_44 = type;
  while( true ) {
    if (items == (lysp_type_enum *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ulong *)&items[-1].flags;
    }
    if (uVar4 <= uVar5) break;
    uVar2 = (pctx->field_0).field_0.options;
    if (local_44 == LY_TYPE_BITS) {
      uVar4 = 0;
      if ((uVar2 & 2) == 0) {
        uVar4 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      format = "%*s<bit name=\"";
    }
    else {
      uVar4 = 0;
      if ((uVar2 & 2) == 0) {
        uVar4 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      format = "%*s<enum name=\"";
    }
    ly_print_((pctx->field_0).field_0.out,format,uVar4,"");
    lyxml_dump_text((pctx->field_0).field_0.out,((lysp_type_enum *)(puVar6 + -0x18))->name,'\x01');
    ly_print_((pctx->field_0).field_0.out,"\"");
    inner_flag = '\0';
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    attr_value = &inner_flag;
    yprp_extension_instances
              (pctx,LY_STMT_ENUM,'\0',*(lysp_ext_instance **)(puVar6 + -4),&inner_flag);
    yprp_iffeatures(pctx,*(lysp_qname **)(puVar6 + -8),*(lysp_ext_instance **)(puVar6 + -4),
                    &inner_flag);
    if ((*puVar6 & 0x200) != 0) {
      ypr_close_parent(pctx,&inner_flag);
      exts = *(lysp_ext_instance **)(puVar6 + -4);
      if (local_44 == LY_TYPE_BITS) {
        ypr_unsigned(pctx,LY_STMT_POSITION,(uint8_t)exts,*(void **)(puVar6 + -0xc),
                     (unsigned_long)attr_value);
      }
      else {
        iVar3 = asprintf(&local_40,"%ld",*(void **)(puVar6 + -0xc));
        if (iVar3 == -1) {
          ly_log(((pctx->field_0).field_0.module)->ctx,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","ypr_signed");
        }
        else {
          ypr_substmt(pctx,LY_STMT_VALUE,'\0',local_40,exts);
          free(local_40);
        }
      }
    }
    ypr_status(pctx,*puVar6,*(lysp_ext_instance **)(puVar6 + -4),&inner_flag);
    ypr_description(pctx,*(char **)(puVar6 + -0x14),*(lysp_ext_instance **)(puVar6 + -4),&inner_flag
                   );
    ypr_reference(pctx,*(char **)(puVar6 + -0x10),*(lysp_ext_instance **)(puVar6 + -4),&inner_flag);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,local_38,inner_flag);
    uVar5 = uVar5 + 1;
    puVar6 = puVar6 + 0x1c;
  }
  return;
}

Assistant:

static void
yprp_enum(struct lys_ypr_ctx *pctx, const struct lysp_type_enum *items, LY_DATA_TYPE type, int8_t *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    int8_t inner_flag;

    (void)flag;

    LY_ARRAY_FOR(items, u) {
        if (type == LY_TYPE_BITS) {
            ly_print_(pctx->out, "%*s<bit name=\"", INDENT);
            lyxml_dump_text(pctx->out, items[u].name, 1);
            ly_print_(pctx->out, "\"");
        } else { /* LY_TYPE_ENUM */
            ly_print_(pctx->out, "%*s<enum name=\"", INDENT);
            lyxml_dump_text(pctx->out, items[u].name, 1);
            ly_print_(pctx->out, "\"");
        }
        inner_flag = 0;
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_ENUM, 0, items[u].exts, &inner_flag);
        yprp_iffeatures(pctx, items[u].iffeatures, items[u].exts, &inner_flag);
        if (items[u].flags & LYS_SET_VALUE) {
            if (type == LY_TYPE_BITS) {
                ypr_close_parent(pctx, &inner_flag);
                ypr_unsigned(pctx, LY_STMT_POSITION, 0, items[u].exts, items[u].value);
            } else { /* LY_TYPE_ENUM */
                ypr_close_parent(pctx, &inner_flag);
                ypr_signed(pctx, LY_STMT_VALUE, 0, items[u].exts, items[u].value);
            }
        }
        ypr_status(pctx, items[u].flags, items[u].exts, &inner_flag);
        ypr_description(pctx, items[u].dsc, items[u].exts, &inner_flag);
        ypr_reference(pctx, items[u].ref, items[u].exts, &inner_flag);
        LEVEL--;
        ypr_close(pctx, type == LY_TYPE_BITS ? "bit" : "enum", inner_flag);
    }
}